

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rate_Coding_Lowpass_Example_Results.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  time_t tVar1;
  Clock *this;
  ANN *this_00;
  SignalGenerator_param *this_01;
  void *pvVar2;
  BSA_SpikeEncodingSynapse_param *this_02;
  BSA_SpikeDecodingSynapse_param *pBVar3;
  BSA_SpikeEncodingSynapse *this_03;
  Population *n_from;
  Population *n_to;
  BSA_SpikeDecodingSynapse_param *param;
  Network_param *this_04;
  ostream *poVar4;
  Network *this_05;
  long in_RSI;
  int in_EDI;
  Network n;
  Network_param *n_param;
  BSA_SpikeDecodingSynapse *s4;
  BSA_SpikeDecodingSynapse_param *params4;
  BSA_SpikeEncodingSynapse *s3;
  BSA_SpikeEncodingSynapse_param *params3;
  BSA_SpikeDecodingSynapse *s2;
  BSA_SpikeDecodingSynapse_param *params2;
  BSA_SpikeEncodingSynapse *s1;
  BSA_SpikeEncodingSynapse_param *params1;
  Population *p5;
  Population *p4;
  Population *p3;
  ArtificialPopulation *p2;
  Population *p1;
  SignalGenerator_param *paramp1;
  ANN *ann;
  string filterType;
  double dt;
  double filter_length;
  double sine7;
  double sine6;
  double sine5;
  double sine4;
  double sine3;
  double sine2;
  double sine1;
  Synapse *in_stack_fffffffffffffd08;
  Network *in_stack_fffffffffffffd10;
  BSA_SpikeEncodingSynapse_param *in_stack_fffffffffffffd38;
  Population *in_stack_fffffffffffffd40;
  Population *in_stack_fffffffffffffd48;
  BSA_SpikeDecodingSynapse *in_stack_fffffffffffffd50;
  ANN *in_stack_fffffffffffffd58;
  ArtificialPopulation *in_stack_fffffffffffffd60;
  string *in_stack_fffffffffffffdc0;
  ANN *pAVar5;
  string *in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdfc;
  Population *in_stack_fffffffffffffe00;
  Parameters *in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  int amount;
  Population *in_stack_fffffffffffffe40;
  allocator<char> local_181;
  string local_180 [32];
  void *local_160;
  undefined1 local_152;
  allocator<char> local_151;
  string local_150 [32];
  void *local_130;
  undefined1 local_122;
  allocator<char> local_121;
  string local_120 [32];
  void *local_100;
  void *local_f8;
  undefined1 local_ea;
  allocator<char> local_e9;
  string local_e8 [32];
  void *local_c8;
  SignalGenerator_param *local_c0;
  string local_b8 [32];
  ANN *local_98;
  allocator<char> local_79;
  string local_78 [32];
  double local_58;
  _func_int **local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  long local_10;
  int local_8;
  int local_4;
  
  amount = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  local_18 = 1.0;
  local_20 = 0.0;
  local_28 = 0.0;
  local_30 = 0.0;
  local_38 = 0.0;
  local_40 = 0.0;
  local_48 = 0.0;
  local_50 = (_func_int **)0x4034000000000000;
  local_58 = 0.0001;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
             (allocator<char> *)in_stack_fffffffffffffd40);
  std::allocator<char>::~allocator(&local_79);
  if (local_8 == 0xb) {
    local_18 = atof(*(char **)(local_10 + 8));
    local_20 = atof(*(char **)(local_10 + 0x10));
    local_28 = atof(*(char **)(local_10 + 0x18));
    local_30 = atof(*(char **)(local_10 + 0x20));
    local_38 = atof(*(char **)(local_10 + 0x28));
    local_40 = atof(*(char **)(local_10 + 0x30));
    local_48 = atof(*(char **)(local_10 + 0x38));
    local_50 = (_func_int **)atof(*(char **)(local_10 + 0x40));
    local_58 = atof(*(char **)(local_10 + 0x48));
    std::__cxx11::string::operator=(local_78,*(char **)(local_10 + 0x50));
  }
  this = Clock::getInstance();
  Clock::setDt(this,local_58);
  this_00 = (ANN *)operator_new(0x40);
  ANN::ANN((ANN *)in_stack_fffffffffffffd10);
  local_98 = this_00;
  ANN::setInputSize(this_00,1);
  pAVar5 = local_98;
  std::__cxx11::string::string(local_b8,local_78);
  ANN::addLayer(this_00,(int)((ulong)pAVar5 >> 0x20),in_stack_fffffffffffffdc0);
  std::__cxx11::string::~string(local_b8);
  this_01 = (SignalGenerator_param *)operator_new(0x58);
  this_01->offset = 0.0;
  this_01->noiseMean = 0.0;
  this_01->f7 = 0.0;
  this_01->scale = 0.0;
  this_01->f5 = 0.0;
  this_01->f6 = 0.0;
  this_01->f3 = 0.0;
  this_01->f4 = 0.0;
  this_01->f1 = 0.0;
  this_01->f2 = 0.0;
  this_01->noiseStd = 0.0;
  SignalGenerator_param::SignalGenerator_param(this_01);
  this_01->f1 = local_18;
  this_01->f2 = local_20;
  this_01->f3 = local_28;
  this_01->f4 = local_30;
  this_01->f5 = local_38;
  this_01->f6 = local_40;
  this_01->f7 = local_48;
  this_01->scale = 0.2;
  this_01->offset = 0.5;
  local_c0 = this_01;
  pvVar2 = operator_new(0x60);
  local_ea = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
             (allocator<char> *)in_stack_fffffffffffffd40);
  Population::Population
            (in_stack_fffffffffffffe40,amount,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  local_ea = 0;
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  local_c8 = pvVar2;
  pvVar2 = operator_new(0x98);
  ArtificialPopulation::ArtificialPopulation(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  local_f8 = pvVar2;
  pvVar2 = operator_new(0x60);
  local_122 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
             (allocator<char> *)in_stack_fffffffffffffd40);
  Population::Population
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0);
  local_122 = 0;
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  local_100 = pvVar2;
  pvVar2 = operator_new(0x60);
  local_152 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
             (allocator<char> *)in_stack_fffffffffffffd40);
  Population::Population
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0);
  local_152 = 0;
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  local_130 = pvVar2;
  pvVar2 = operator_new(0x60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
             (allocator<char> *)in_stack_fffffffffffffd40);
  Population::Population
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  local_160 = pvVar2;
  this_02 = (BSA_SpikeEncodingSynapse_param *)operator_new(0x20);
  this_02->scale = 0.0;
  *(undefined8 *)&this_02->window = 0;
  this_02->filter_length = 0.0;
  this_02->threshold = 0.0;
  BSA_SpikeEncodingSynapse_param::BSA_SpikeEncodingSynapse_param(this_02);
  this_02->filter_length = (double)local_50;
  this_02->threshold = 0.995;
  this_02->scale = 0.125;
  operator_new(0x98);
  BSA_SpikeEncodingSynapse::BSA_SpikeEncodingSynapse
            ((BSA_SpikeEncodingSynapse *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  pBVar3 = (BSA_SpikeDecodingSynapse_param *)operator_new(0x20);
  pBVar3->scale = 0.0;
  *(undefined8 *)&pBVar3->window = 0;
  pBVar3->filter_length = 0.0;
  pBVar3->threshold = 0.0;
  BSA_SpikeDecodingSynapse_param::BSA_SpikeDecodingSynapse_param(pBVar3);
  pBVar3->filter_length = 500.0;
  pBVar3->threshold = 0.995;
  pBVar3->scale = 0.125;
  pvVar2 = operator_new(0x98);
  BSA_SpikeDecodingSynapse::BSA_SpikeDecodingSynapse
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
             (BSA_SpikeDecodingSynapse_param *)in_stack_fffffffffffffd38);
  this_03 = (BSA_SpikeEncodingSynapse *)operator_new(0x20);
  (this_03->super_Synapse).to_population = (Population *)0x0;
  this_03->param = (BSA_SpikeEncodingSynapse_param *)0x0;
  (this_03->super_Synapse)._vptr_Synapse = (_func_int **)0x0;
  (this_03->super_Synapse).from_population = (Population *)0x0;
  BSA_SpikeEncodingSynapse_param::BSA_SpikeEncodingSynapse_param
            ((BSA_SpikeEncodingSynapse_param *)this_03);
  (this_03->super_Synapse)._vptr_Synapse = local_50;
  (this_03->super_Synapse).from_population = (Population *)0x3fefd70a3d70a3d7;
  (this_03->super_Synapse).to_population = (Population *)0x3fc0000000000000;
  n_from = (Population *)operator_new(0x98);
  BSA_SpikeEncodingSynapse::BSA_SpikeEncodingSynapse
            (this_03,n_from,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  n_to = (Population *)operator_new(0x20);
  (n_to->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (n_to->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  n_to->_vptr_Population = (_func_int **)0x0;
  (n_to->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  BSA_SpikeDecodingSynapse_param::BSA_SpikeDecodingSynapse_param
            ((BSA_SpikeDecodingSynapse_param *)n_to);
  n_to->_vptr_Population = local_50;
  (n_to->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3fefd70a3d70a3d7;
  (n_to->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x3fc0000000000000;
  param = (BSA_SpikeDecodingSynapse_param *)operator_new(0x98);
  BSA_SpikeDecodingSynapse::BSA_SpikeDecodingSynapse
            ((BSA_SpikeDecodingSynapse *)this_03,n_from,n_to,param);
  pBVar3 = param;
  this_04 = (Network_param *)operator_new(8);
  this_04->dt = 0.0;
  Network_param::Network_param(this_04);
  this_04->dt = local_58;
  Network::Network((Network *)n_to,(Network_param *)param);
  Network::add(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  Network::add(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  Network::add(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  Network::add(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(long)pvVar2);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(long)pBVar3);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(long)local_100);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  this_05 = (Network *)std::ostream::operator<<((ostream *)&std::cout,(long)local_130);
  std::ostream::operator<<((ostream *)this_05,std::endl<char,std::char_traits<char>>);
  Network::run((Network *)n_to,(double)param);
  local_4 = 0;
  Network::~Network(this_05);
  std::__cxx11::string::~string(local_78);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) 
{
    srand(time(NULL));

    // Command line arguments
    double sine1 = 1;
    double sine2 = 0;
    double sine3 = 0;
    double sine4 = 0;
    double sine5 = 0;
    double sine6 = 0;
    double sine7 = 0;
    double filter_length = 20;
    double dt = 0.0001;
    string filterType = "lowpass";
    if(argc == 11) {
        sine1 = atof(argv[1]);
        sine2 = atof(argv[2]);
        sine3 = atof(argv[3]);
        sine4 = atof(argv[4]);
        sine5 = atof(argv[5]);
        sine6 = atof(argv[6]);
        sine7 = atof(argv[7]);
        filter_length = atof(argv[8]);
        dt = atof(argv[9]);
        filterType = argv[10];
    }
    // ----------------------

    Clock::getInstance()->setDt(dt);

    ANN* ann = new ANN();
    ann->setInputSize(1);
    ann->addLayer(1, filterType);

    // Populations
    SignalGenerator_param* paramp1 = new SignalGenerator_param();
    paramp1->f1 = sine1;
    paramp1->f2 = sine2;
    paramp1->f3 = sine3;
    paramp1->f4 = sine4;
    paramp1->f5 = sine5;
    paramp1->f6 = sine6;
    paramp1->f7 = sine7;
    paramp1->scale = 1/5.0;
    paramp1->offset = 0.5;
    Population* p1 = new Population(1, "SignalGenerator", paramp1);

    ArtificialPopulation* p2 = new ArtificialPopulation(ann);

    Population* p3 = new Population(1, "iaf_psc_alpha");
    Population* p4 = new Population(1, "iaf_psc_alpha");
    Population* p5 = new Population(1, "PassThrough");

    // Synapses
    BSA_SpikeEncodingSynapse_param* params1 = new BSA_SpikeEncodingSynapse_param();
    params1->filter_length = filter_length;
    params1->threshold = 0.995;
    params1->scale = 1.0/8.0;
    BSA_SpikeEncodingSynapse* s1 = new BSA_SpikeEncodingSynapse(p1, p3, params1);

    BSA_SpikeDecodingSynapse_param* params2 = new BSA_SpikeDecodingSynapse_param();
    params2->filter_length = 500;
    params2->threshold = 0.995;
    params2->scale = 1.0/8.0;
    BSA_SpikeDecodingSynapse* s2 = new BSA_SpikeDecodingSynapse(p3, p2, params2);

    // Synapses
    BSA_SpikeEncodingSynapse_param* params3 = new BSA_SpikeEncodingSynapse_param();
    params3->filter_length = filter_length;
    params3->threshold = 0.995;
    params3->scale = 1.0/8.0;
    BSA_SpikeEncodingSynapse* s3 = new BSA_SpikeEncodingSynapse(p2, p4, params3);

    BSA_SpikeDecodingSynapse_param* params4 = new BSA_SpikeDecodingSynapse_param();
    params4->filter_length = filter_length;
    params4->threshold = 0.995;
    params4->scale = 1.0/8.0;
    BSA_SpikeDecodingSynapse* s4 = new BSA_SpikeDecodingSynapse(p4, p5, params4);

    // Create the network
    Network_param* n_param = new Network_param();
    n_param->dt = dt;
    Network n = Network(n_param);

    // Add the synapse to the network
    n.add(s1);
    n.add(s2);
    n.add(s3);
    n.add(s4);

    cout << (long)s2 << endl;
    cout << (long)s4 << endl;
    cout << (long)p3 << endl;
    cout << (long)p4 << endl;

    // Run the network for 1 second
    n.run(10.0);
    
    return 0;
}